

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::LocationValidator::validateSingleVariable
          (LocationValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  GLuint GVar1;
  code *pcVar2;
  undefined4 uVar3;
  string *psVar4;
  bool bVar5;
  DataType dataType;
  deUint32 dVar6;
  int iVar7;
  GLenum GVar8;
  int iVar9;
  const_reference pvVar10;
  VarType *pVVar11;
  InterfaceBlock *pIVar12;
  VariableDeclaration *pVVar13;
  TestLog *pTVar14;
  MessageBuilder *pMVar15;
  size_type sVar16;
  undefined4 extraout_var;
  ulong uVar17;
  undefined8 uVar18;
  bool local_1009;
  VariablePathComponent *local_1000;
  bool local_f96;
  bool local_f95;
  Storage local_f94;
  bool local_f82;
  allocator<char> local_f81;
  string local_f80;
  MessageBuilder local_f60;
  int local_ddc;
  undefined1 local_dd8 [4];
  GLint location_1;
  allocator<char> local_c51;
  string local_c50;
  int local_c2c;
  MessageBuilder local_c28;
  int local_aa4;
  undefined1 local_aa0 [4];
  GLint location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  undefined1 local_a40 [8];
  string elementResourceName;
  int arrayElementNdx;
  string arrayResourceName;
  GLenum interface;
  Functions *gl;
  bool isArray;
  VariablePathComponent *enclosingcomponent;
  VariablePathComponent nullComponent;
  string local_840;
  MessageBuilder local_820;
  MessageBuilder local_6a0;
  MessageBuilder local_520;
  bool local_39a;
  allocator<char> local_399;
  undefined1 local_398 [6];
  bool locationOk;
  MessageBuilder local_378;
  MessageBuilder local_1f8;
  undefined1 local_68 [8];
  string reasonStr;
  int local_40;
  bool local_3a;
  bool expectLocation;
  int explicitLayoutLocation;
  byte local_34;
  byte local_33;
  bool isOutputVariable;
  bool isInputVariable;
  Storage storage;
  bool isFragmentShader;
  bool isVertexShader;
  bool isUniformBlockVariable;
  bool isAtomicCounterUniform;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  LocationValidator *this_local;
  
  _storage = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)path;
  path_local = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)this;
  pvVar10 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            ::back(path);
  pVVar11 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(pvVar10);
  dataType = glu::VarType::getBasicType(pVVar11);
  isInputVariable = glu::isDataTypeAtomicCounter(dataType);
  pvVar10 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            ::front((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                     *)resource_local);
  bVar5 = ProgramInterfaceDefinition::VariablePathComponent::isInterfaceBlock(pvVar10);
  local_f82 = false;
  if (bVar5) {
    pvVar10 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
              ::front((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                       *)resource_local);
    pIVar12 = ProgramInterfaceDefinition::VariablePathComponent::getInterfaceBlock(pvVar10);
    local_f82 = pIVar12->storage == STORAGE_UNIFORM;
  }
  isOutputVariable = local_f82;
  dVar6 = ProgramInterfaceDefinition::VariableSearchFilter::getShaderTypeBits
                    ((VariableSearchFilter *)
                     &(this->super_SingleVariableValidator).super_PropValidator.field_0x2c);
  local_33 = dVar6 == 1;
  dVar6 = ProgramInterfaceDefinition::VariableSearchFilter::getShaderTypeBits
                    ((VariableSearchFilter *)
                     &(this->super_SingleVariableValidator).super_PropValidator.field_0x2c);
  local_34 = dVar6 == 2;
  pvVar10 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            ::front((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                     *)resource_local);
  bVar5 = ProgramInterfaceDefinition::VariablePathComponent::isInterfaceBlock(pvVar10);
  if (bVar5) {
    pvVar10 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
              ::front((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                       *)resource_local);
    pIVar12 = ProgramInterfaceDefinition::VariablePathComponent::getInterfaceBlock(pvVar10);
    local_f94 = pIVar12->storage;
  }
  else {
    pvVar10 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
              ::front((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                       *)resource_local);
    pVVar13 = ProgramInterfaceDefinition::VariablePathComponent::getDeclaration(pvVar10);
    local_f94 = pVVar13->storage;
  }
  explicitLayoutLocation = local_f94;
  local_f95 = local_f94 == STORAGE_IN || local_f94 == STORAGE_PATCH_IN;
  expectLocation = local_f95;
  local_f96 = local_f94 == STORAGE_OUT || local_f94 == STORAGE_PATCH_OUT;
  local_3a = local_f96;
  local_40 = getExplicitLocationFromPath
                       ((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                         *)resource_local);
  std::__cxx11::string::string((string *)local_68);
  if ((isInputVariable & 1U) == 0) {
    if ((isOutputVariable & 1U) == 0) {
      if ((((expectLocation & 1U) == 0) || ((local_33 & 1) != 0)) || (local_40 != -1)) {
        if ((((local_3a & 1U) == 0) || ((local_34 & 1) != 0)) || (local_40 != -1)) {
          reasonStr.field_2._M_local_buf[0xf] = '\x01';
        }
        else {
          reasonStr.field_2._M_local_buf[0xf] = '\0';
          std::__cxx11::string::operator=
                    ((string *)local_68,
                     "Outputs (except for fragment shader outputs) not declared with a location layout qualifier have effective location of -1"
                    );
        }
      }
      else {
        reasonStr.field_2._M_local_buf[0xf] = '\0';
        std::__cxx11::string::operator=
                  ((string *)local_68,
                   "Inputs (except for vertex shader inputs) not declared with a location layout qualifier have effective location of -1"
                  );
      }
    }
    else {
      reasonStr.field_2._M_local_buf[0xf] = '\0';
      std::__cxx11::string::operator=
                ((string *)local_68,"Uniform block variables have effective location of -1");
    }
  }
  else {
    reasonStr.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::operator=
              ((string *)local_68,"Atomic counter uniforms have effective location of -1");
  }
  if ((reasonStr.field_2._M_local_buf[0xf] & 1U) == 0) {
    pTVar14 = tcu::TestContext::getLog
                        ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_1f8,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar15 = tcu::MessageBuilder::operator<<
                        (&local_1f8,(char (*) [44])"Verifying uniform location, expecting -1. (");
    pMVar15 = tcu::MessageBuilder::operator<<
                        (pMVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_68);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2a94734);
    tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1f8);
    if (implementationName_local._4_4_ != -1) {
      pTVar14 = tcu::TestContext::getLog
                          ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_378,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<(&local_378,(char (*) [13])"\tError, got ");
      pMVar15 = tcu::MessageBuilder::operator<<
                          (pMVar15,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_378);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_398,"resource location invalid",&local_399);
      PropValidator::setError((PropValidator *)this,(string *)local_398);
      std::__cxx11::string::~string((string *)local_398);
      std::allocator<char>::~allocator(&local_399);
    }
  }
  else {
    if (local_40 == -1) {
      pTVar14 = tcu::TestContext::getLog
                          ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_520,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (&local_520,
                           (char (*) [47])"Verifying location, expecting a valid location");
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_520);
      local_39a = implementationName_local._4_4_ != -1;
    }
    else {
      pTVar14 = tcu::TestContext::getLog
                          ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_6a0,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (&local_6a0,(char (*) [31])"Verifying location, expecting ");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_40);
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6a0);
      local_39a = implementationName_local._4_4_ == local_40;
    }
    if (local_39a == false) {
      pTVar14 = tcu::TestContext::getLog
                          ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_820,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<(&local_820,(char (*) [13])"\tError, got ");
      pMVar15 = tcu::MessageBuilder::operator<<
                          (pMVar15,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_820);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_840,"resource location invalid",
                 (allocator<char> *)&nullComponent.field_0xf);
      PropValidator::setError((PropValidator *)this,&local_840);
      std::__cxx11::string::~string((string *)&local_840);
      std::allocator<char>::~allocator((allocator<char> *)&nullComponent.field_0xf);
    }
    else {
      ProgramInterfaceDefinition::VariablePathComponent::VariablePathComponent
                ((VariablePathComponent *)&enclosingcomponent);
      sVar16 = std::
               vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               ::size((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                       *)resource_local);
      psVar4 = resource_local;
      if (sVar16 < 2) {
        local_1000 = (VariablePathComponent *)&enclosingcomponent;
      }
      else {
        sVar16 = std::
                 vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                 ::size((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                         *)resource_local);
        local_1000 = std::
                     vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                     ::operator[]((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                                   *)psVar4,sVar16 - 2);
      }
      bVar5 = ProgramInterfaceDefinition::VariablePathComponent::isVariableType(local_1000);
      local_1009 = false;
      if (bVar5) {
        pVVar11 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(local_1000);
        local_1009 = glu::VarType::isArrayType(pVVar11);
      }
      iVar7 = (*((this->super_SingleVariableValidator).super_PropValidator.m_renderContext)->
                _vptr_RenderContext[3])();
      GVar8 = getProgramDefaultBlockInterfaceFromStorage(explicitLayoutLocation);
      pTVar14 = tcu::TestContext::getLog
                          ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)((long)&arrayResourceName.field_2 + 8),pTVar14,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)((long)&arrayResourceName.field_2 + 8),
                           (char (*) [72])
                           "Comparing location to the values returned by GetProgramResourceLocation"
                          );
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)((long)&arrayResourceName.field_2 + 8))
      ;
      if (local_1009 == false) {
        pcVar2 = *(code **)(CONCAT44(extraout_var,iVar7) + 0x9b0);
        GVar1 = (this->super_SingleVariableValidator).m_programID;
        uVar18 = std::__cxx11::string::c_str();
        local_ddc = (*pcVar2)(GVar1,GVar8,uVar18);
        if (local_ddc != implementationName_local._4_4_) {
          pTVar14 = tcu::TestContext::getLog
                              ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
          tcu::TestLog::operator<<(&local_f60,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar15 = tcu::MessageBuilder::operator<<
                              (&local_f60,
                               (char (*) [54])
                               "\tError, getProgramResourceLocation returned location ");
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_ddc);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [12])0x2c24a65);
          pMVar15 = tcu::MessageBuilder::operator<<
                              (pMVar15,(int *)((long)&implementationName_local + 4));
          tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_f60);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f80,"resource location invalid",&local_f81);
          PropValidator::setError((PropValidator *)this,&local_f80);
          std::__cxx11::string::~string((string *)&local_f80);
          std::allocator<char>::~allocator(&local_f81);
        }
      }
      else {
        uVar17 = std::__cxx11::string::size();
        psVar4 = _storage;
        elementResourceName.field_2._M_local_buf[0xe] = '\0';
        if (uVar17 < 4) {
          std::allocator<char>::allocator();
          elementResourceName.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&arrayElementNdx,"",
                     (allocator<char> *)(elementResourceName.field_2._M_local_buf + 0xf));
        }
        else {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)&arrayElementNdx,(ulong)psVar4);
        }
        if ((elementResourceName.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)(elementResourceName.field_2._M_local_buf + 0xf));
        }
        elementResourceName.field_2._8_4_ = 0;
        while( true ) {
          uVar3 = elementResourceName.field_2._8_4_;
          pVVar11 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(local_1000);
          iVar9 = glu::VarType::getArraySize(pVVar11);
          if (iVar9 <= (int)uVar3) break;
          std::operator+(&local_a80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &arrayElementNdx,"[");
          de::toString<int>((string *)local_aa0,
                            (int *)(elementResourceName.field_2._M_local_buf + 8));
          std::operator+(&local_a60,&local_a80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_aa0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a40,&local_a60,"]");
          std::__cxx11::string::~string((string *)&local_a60);
          std::__cxx11::string::~string((string *)local_aa0);
          std::__cxx11::string::~string((string *)&local_a80);
          pcVar2 = *(code **)(CONCAT44(extraout_var,iVar7) + 0x9b0);
          GVar1 = (this->super_SingleVariableValidator).m_programID;
          uVar18 = std::__cxx11::string::c_str();
          local_aa4 = (*pcVar2)(GVar1,GVar8,uVar18);
          if (local_aa4 == implementationName_local._4_4_ + elementResourceName.field_2._8_4_) {
            pTVar14 = tcu::TestContext::getLog
                                ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx
                                );
            tcu::TestLog::operator<<
                      ((MessageBuilder *)local_dd8,pTVar14,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar15 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_dd8,(char (*) [15])"\tLocation of \"");
            pMVar15 = tcu::MessageBuilder::operator<<
                                (pMVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_a40);
            pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [4])"\":\t");
            pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_aa4);
            tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_dd8);
          }
          else {
            pTVar14 = tcu::TestContext::getLog
                                ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx
                                );
            tcu::TestLog::operator<<(&local_c28,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar15 = tcu::MessageBuilder::operator<<
                                (&local_c28,
                                 (char (*) [47])"\tError, getProgramResourceLocation (resource=\"");
            pMVar15 = tcu::MessageBuilder::operator<<
                                (pMVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_a40);
            pMVar15 = tcu::MessageBuilder::operator<<
                                (pMVar15,(char (*) [22])"\") returned location ");
            pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_aa4);
            pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [12])0x2c24a65);
            local_c2c = implementationName_local._4_4_ + elementResourceName.field_2._8_4_;
            pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_c2c);
            tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_c28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c50,"resource location invalid",&local_c51);
            PropValidator::setError((PropValidator *)this,&local_c50);
            std::__cxx11::string::~string((string *)&local_c50);
            std::allocator<char>::~allocator(&local_c51);
          }
          std::__cxx11::string::~string((string *)local_a40);
          elementResourceName.field_2._8_4_ = elementResourceName.field_2._8_4_ + 1;
        }
        std::__cxx11::string::~string((string *)&arrayElementNdx);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void LocationValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const bool			isAtomicCounterUniform	= glu::isDataTypeAtomicCounter(path.back().getVariableType()->getBasicType());
	const bool			isUniformBlockVariable	= path.front().isInterfaceBlock() && path.front().getInterfaceBlock()->storage == glu::STORAGE_UNIFORM;
	const bool			isVertexShader			= m_filter.getShaderTypeBits() == (1u << glu::SHADERTYPE_VERTEX);
	const bool			isFragmentShader		= m_filter.getShaderTypeBits() == (1u << glu::SHADERTYPE_FRAGMENT);
	const glu::Storage	storage					= (path.front().isInterfaceBlock()) ? (path.front().getInterfaceBlock()->storage) : (path.front().getDeclaration()->storage);
	const bool			isInputVariable			= (storage == glu::STORAGE_IN || storage == glu::STORAGE_PATCH_IN);
	const bool			isOutputVariable		= (storage == glu::STORAGE_OUT || storage == glu::STORAGE_PATCH_OUT);
	const int			explicitLayoutLocation	= getExplicitLocationFromPath(path);

	bool				expectLocation;
	std::string			reasonStr;

	DE_UNREF(resource);

	if (isAtomicCounterUniform)
	{
		expectLocation = false;
		reasonStr = "Atomic counter uniforms have effective location of -1";
	}
	else if (isUniformBlockVariable)
	{
		expectLocation = false;
		reasonStr = "Uniform block variables have effective location of -1";
	}
	else if (isInputVariable && !isVertexShader && explicitLayoutLocation == -1)
	{
		expectLocation = false;
		reasonStr = "Inputs (except for vertex shader inputs) not declared with a location layout qualifier have effective location of -1";
	}
	else if (isOutputVariable && !isFragmentShader && explicitLayoutLocation == -1)
	{
		expectLocation = false;
		reasonStr = "Outputs (except for fragment shader outputs) not declared with a location layout qualifier have effective location of -1";
	}
	else
	{
		expectLocation = true;
	}

	if (!expectLocation)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying uniform location, expecting -1. (" << reasonStr << ")" << tcu::TestLog::EndMessage;

		if (propValue != -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource location invalid");
		}
	}
	else
	{
		bool locationOk;

		if (explicitLayoutLocation == -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying location, expecting a valid location" << tcu::TestLog::EndMessage;
			locationOk = (propValue != -1);
		}
		else
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying location, expecting " << explicitLayoutLocation << tcu::TestLog::EndMessage;
			locationOk = (propValue == explicitLayoutLocation);
		}

		if (!locationOk)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource location invalid");
		}
		else
		{
			const VariablePathComponent		nullComponent;
			const VariablePathComponent&	enclosingcomponent	= (path.size() > 1) ? (path[path.size()-2]) : (nullComponent);
			const bool						isArray				= enclosingcomponent.isVariableType() && enclosingcomponent.getVariableType()->isArrayType();

			const glw::Functions&			gl					= m_renderContext.getFunctions();
			const glw::GLenum				interface			= getProgramDefaultBlockInterfaceFromStorage(storage);

			m_testCtx.getLog() << tcu::TestLog::Message << "Comparing location to the values returned by GetProgramResourceLocation" << tcu::TestLog::EndMessage;

			// Test all bottom-level array elements
			if (isArray)
			{
				const std::string arrayResourceName = (implementationName.size() > 3) ? (implementationName.substr(0, implementationName.size() - 3)) : (""); // chop "[0]"

				for (int arrayElementNdx = 0; arrayElementNdx < enclosingcomponent.getVariableType()->getArraySize(); ++arrayElementNdx)
				{
					const std::string	elementResourceName	= arrayResourceName + "[" + de::toString(arrayElementNdx) + "]";
					const glw::GLint	location			= gl.getProgramResourceLocation(m_programID, interface, elementResourceName.c_str());

					if (location != propValue+arrayElementNdx)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "\tError, getProgramResourceLocation (resource=\"" << elementResourceName << "\") returned location " << location
							<< ", expected " << (propValue+arrayElementNdx)
							<< tcu::TestLog::EndMessage;
						setError("resource location invalid");
					}
					else
						m_testCtx.getLog() << tcu::TestLog::Message << "\tLocation of \"" << elementResourceName << "\":\t" << location << tcu::TestLog::EndMessage;
				}
			}
			else
			{
				const glw::GLint location = gl.getProgramResourceLocation(m_programID, interface, implementationName.c_str());

				if (location != propValue)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "\tError, getProgramResourceLocation returned location " << location << ", expected " << propValue << tcu::TestLog::EndMessage;
					setError("resource location invalid");
				}
			}

		}
	}
}